

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  TcParseTableBase *pTVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  ushort *puVar8;
  char *pcVar9;
  ushort *puVar10;
  string *psVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long *plVar14;
  Arena *arena;
  uint *puVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  ushort *local_48 [2];
  long local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar15 & 3) != 0) {
      AlignFail();
    }
    *puVar15 = *puVar15 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar14 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  pTVar5 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*plVar14 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(pTVar5->class_data,arena);
    *plVar14 = (long)pMVar6;
  }
  iVar17 = ctx->depth_;
  local_38 = (long)iVar17 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar17 < 1) {
    puVar8 = (ushort *)0x0;
  }
  else {
    local_48[0] = (ushort *)(ptr + 1);
    lVar18 = (long)ctx->group_depth_ + 1;
    iVar17 = (int)lVar18;
    ctx->group_depth_ = iVar17;
    pMVar6 = (MessageLite *)*plVar14;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_),
          !bVar3) {
      uVar4 = (uint)pTVar5->fast_idx_mask & (uint)*local_48[0];
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar7 = (ulong)(uVar4 & 0xfffffff8);
      local_48[0] = (ushort *)
                    (**(code **)(&pTVar5[1].has_bits_offset + uVar7))
                              (pMVar6,local_48[0],ctx,
                               (ulong)*local_48[0] ^
                               *(ulong *)(&pTVar5[1].fast_idx_mask + uVar7 * 2),pTVar5,0);
      if ((local_48[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar10 = local_48[0];
    if ((pTVar5->field_0x9 & 1) != 0) {
      puVar10 = (ushort *)(*pTVar5->post_loop_handler)(pMVar6,(char *)local_48[0],ctx);
    }
    if (puVar10 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        psVar11 = (string *)0x0;
      }
      else {
        psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar11 != (string *)0x0) {
        uVar16 = *(undefined8 *)psVar11;
        uVar12 = *(undefined8 *)(psVar11 + 8);
        uVar13 = 0x45b;
LAB_0014d8c3:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar13,uVar12,uVar16);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_48);
      }
      if (iVar17 == ctx->group_depth_) {
        psVar11 = (string *)0x0;
      }
      else {
        psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (lVar18,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (psVar11 != (string *)0x0) {
        uVar16 = *(undefined8 *)psVar11;
        uVar12 = *(undefined8 *)(psVar11 + 8);
        uVar13 = 0x45c;
        goto LAB_0014d8c3;
      }
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar8 = (ushort *)0x0;
    if (uVar2 == bVar1) {
      puVar8 = puVar10;
    }
  }
  return (char *)puVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}